

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fourier_transform.cc
# Opt level: O3

void __thiscall sptk::FourierTransform::FourierTransform(FourierTransform *this,int length)

{
  bool bVar1;
  FourierTransformInterface *pFVar2;
  
  this->_vptr_FourierTransform = (_func_int **)&PTR__FourierTransform_00112ba8;
  bVar1 = IsPowerOfTwo(length);
  if (bVar1) {
    pFVar2 = (FourierTransformInterface *)operator_new(0x38);
    pFVar2->_vptr_FourierTransformInterface =
         (_func_int **)&PTR__FastFourierTransformWrapper_00112bd8;
    FastFourierTransform::FastFourierTransform((FastFourierTransform *)(pFVar2 + 1),length);
  }
  else {
    pFVar2 = (FourierTransformInterface *)operator_new(0x48);
    pFVar2->_vptr_FourierTransformInterface =
         (_func_int **)&PTR__DiscreteFourierTransformWrapper_00112c30;
    DiscreteFourierTransform::DiscreteFourierTransform
              ((DiscreteFourierTransform *)(pFVar2 + 1),length);
  }
  this->fourier_transform_ = pFVar2;
  return;
}

Assistant:

FourierTransform::FourierTransform(int length) {
  if (sptk::IsPowerOfTwo(length)) {
    fourier_transform_ = new FastFourierTransformWrapper(length);
  } else {
    fourier_transform_ = new DiscreteFourierTransformWrapper(length);
  }
}